

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathSubstringBeforeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr ctxt_00;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlBufPtr buf;
  xmlChar *pxVar1;
  xmlXPathObjectPtr value;
  int iStack_30;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 2) {
    if (ctxt->valueFrame + 2 <= ctxt->valueNr) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      obj = valuePop(ctxt);
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      obj_00 = valuePop(ctxt);
      buf = xmlBufCreate();
      if (buf != (xmlBufPtr)0x0) {
        pxVar1 = xmlStrstr(obj_00->stringval,obj->stringval);
        if (pxVar1 != (xmlChar *)0x0) {
          xmlBufAdd(buf,obj_00->stringval,(int)pxVar1 - (int)obj_00->stringval);
        }
        ctxt_00 = ctxt->context;
        pxVar1 = xmlBufContent(buf);
        value = xmlXPathCacheNewString(ctxt_00,pxVar1);
        valuePush(ctxt,value);
        xmlBufFree(buf);
      }
      xmlXPathReleaseObject(ctxt->context,obj_00);
      xmlXPathReleaseObject(ctxt->context,obj);
      return;
    }
    iStack_30 = 0x17;
  }
  else {
    iStack_30 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_30);
  return;
}

Assistant:

void
xmlXPathSubstringBeforeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
  xmlXPathObjectPtr str;
  xmlXPathObjectPtr find;
  xmlBufPtr target;
  const xmlChar *point;
  int offset;

  CHECK_ARITY(2);
  CAST_TO_STRING;
  find = valuePop(ctxt);
  CAST_TO_STRING;
  str = valuePop(ctxt);

  target = xmlBufCreate();
  if (target) {
    point = xmlStrstr(str->stringval, find->stringval);
    if (point) {
      offset = (int)(point - str->stringval);
      xmlBufAdd(target, str->stringval, offset);
    }
    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
	xmlBufContent(target)));
    xmlBufFree(target);
  }
  xmlXPathReleaseObject(ctxt->context, str);
  xmlXPathReleaseObject(ctxt->context, find);
}